

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

QTextObject * __thiscall
QTextDocumentPrivate::objectForIndex(QTextDocumentPrivate *this,int objectIndex)

{
  long lVar1;
  int in_ESI;
  QTextFormatCollection *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentPrivate *that;
  QTextObject *object;
  QTextFormat fmt;
  int *in_stack_ffffffffffffffb8;
  QMap<int,_QTextObject_*> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  QTextObject *pQVar2;
  int objectIndex_00;
  QTextFormat *f;
  undefined4 in_stack_ffffffffffffffe0;
  
  objectIndex_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    pQVar2 = (QTextObject *)0x0;
  }
  else {
    f = (QTextFormat *)0x0;
    pQVar2 = QMap<int,_QTextObject_*>::value
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(QTextObject **)in_RDI);
    if (pQVar2 == (QTextObject *)0x0) {
      QTextFormatCollection::objectFormat(in_RDI,0);
      pQVar2 = createObject((QTextDocumentPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),f,
                            objectIndex_00);
      QTextFormat::~QTextFormat((QTextFormat *)0x7d5638);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QTextObject *QTextDocumentPrivate::objectForIndex(int objectIndex) const
{
    if (objectIndex < 0)
        return nullptr;

    QTextObject *object = objects.value(objectIndex, nullptr);
    if (!object) {
        QTextDocumentPrivate *that = const_cast<QTextDocumentPrivate *>(this);
        QTextFormat fmt = formats.objectFormat(objectIndex);
        object = that->createObject(fmt, objectIndex);
    }
    return object;
}